

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2convex_hull_query.cc
# Opt level: O3

void __thiscall S2ConvexHullQuery::AddLoop(S2ConvexHullQuery *this,S2Loop *loop)

{
  pointer *ppVVar1;
  iterator __position;
  VType VVar2;
  S2Point *__args;
  int i;
  int i_00;
  S2LatLngRect local_70;
  S2LatLngRect local_48;
  
  local_70.super_S2Region._vptr_S2Region = (_func_int **)&PTR__S2Region_002bc088;
  local_70.lat_.bounds_.c_[0] = (loop->bound_).lat_.bounds_.c_[0];
  local_70.lat_.bounds_.c_[1] = (loop->bound_).lat_.bounds_.c_[1];
  local_70.lng_.bounds_.c_[0] = (loop->bound_).lng_.bounds_.c_[0];
  local_70.lng_.bounds_.c_[1] = (loop->bound_).lng_.bounds_.c_[1];
  S2LatLngRect::Union(&local_48,&this->bound_,&local_70);
  (this->bound_).lng_.bounds_.c_[0] = local_48.lng_.bounds_.c_[0];
  (this->bound_).lng_.bounds_.c_[1] = local_48.lng_.bounds_.c_[1];
  (this->bound_).lat_.bounds_.c_[0] = local_48.lat_.bounds_.c_[0];
  (this->bound_).lat_.bounds_.c_[1] = local_48.lat_.bounds_.c_[1];
  if (1 < loop->num_vertices_) {
    i_00 = 0;
    do {
      __args = S2Loop::vertex(loop,i_00);
      __position._M_current =
           (this->points_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->points_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
        _M_realloc_insert<Vector3<double>const&>
                  ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)&this->points_,
                   __position,__args);
      }
      else {
        (__position._M_current)->c_[2] = __args->c_[2];
        VVar2 = __args->c_[1];
        (__position._M_current)->c_[0] = __args->c_[0];
        (__position._M_current)->c_[1] = VVar2;
        ppVVar1 = &(this->points_).
                   super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppVVar1 = *ppVVar1 + 1;
      }
      i_00 = i_00 + 1;
    } while (i_00 < loop->num_vertices_);
  }
  return;
}

Assistant:

void S2ConvexHullQuery::AddLoop(const S2Loop& loop) {
  bound_ = bound_.Union(loop.GetRectBound());
  if (loop.is_empty_or_full()) {
    // The empty and full loops consist of a single fake "vertex" that should
    // not be added to our point collection.
    return;
  }
  for (int i = 0; i < loop.num_vertices(); ++i) {
    points_.push_back(loop.vertex(i));
  }
}